

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O2

ActionBlockSyntax * __thiscall slang::parsing::Parser::parseActionBlock(Parser *this)

{
  bool bVar1;
  StatementSyntax *statement;
  ElseClauseSyntax *elseClause;
  ActionBlockSyntax *pAVar2;
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,ElseKeyword);
  if (bVar1) {
    statement = (StatementSyntax *)0x0;
  }
  else {
    elseClause = (ElseClauseSyntax *)0x0;
    statement = parseStatement(this,true,false);
    if ((statement->super_SyntaxNode).kind == EmptyStatement) goto LAB_0057eedf;
  }
  elseClause = parseElseClause(this);
LAB_0057eedf:
  pAVar2 = slang::syntax::SyntaxFactory::actionBlock(&this->factory,statement,elseClause);
  return pAVar2;
}

Assistant:

ActionBlockSyntax& Parser::parseActionBlock() {
    StatementSyntax* statement = nullptr;
    ElseClauseSyntax* elseClause = nullptr;

    if (peek(TokenKind::ElseKeyword))
        elseClause = parseElseClause();
    else {
        statement = &parseStatement();
        if (statement->kind != SyntaxKind::EmptyStatement)
            elseClause = parseElseClause();
    }

    return factory.actionBlock(statement, elseClause);
}